

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O0

char * otense(obj *otmp,char *verb)

{
  char *buf;
  char *verb_local;
  obj *otmp_local;
  
  if ((otmp->quan < 2) && (otmp->oartifact != '\x1d')) {
    otmp_local = (obj *)vtense((char *)0x0,verb);
  }
  else {
    otmp_local = (obj *)nextobuf();
    strcpy((char *)otmp_local,verb);
  }
  return (char *)otmp_local;
}

Assistant:

char *otense(const struct obj *otmp, const char *verb)
{
	char *buf;

	/*
	 * verb is given in plural (without trailing s).  Return as input
	 * if the result of xname(otmp) would be plural.  Don't bother
	 * recomputing xname(otmp) at this time.
	 */
	if (!is_plural(otmp))
	    return vtense(NULL, verb);

	buf = nextobuf();
	strcpy(buf, verb);
	return buf;
}